

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O0

Own<capnp::compiler::BrandScope,_std::nullptr_t> __thiscall
capnp::compiler::BrandScope::pop(BrandScope *this,uint64_t newLeafId)

{
  Own<capnp::compiler::BrandScope,_std::nullptr_t> *this_00;
  BrandScope *pBVar1;
  long in_RDX;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> OVar2;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> *p;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> *_p318;
  uint64_t newLeafId_local;
  BrandScope *this_local;
  
  newLeafId_local = newLeafId;
  this_local = this;
  if (*(long *)(newLeafId + 0x28) == in_RDX) {
    OVar2 = kj::addRef<capnp::compiler::BrandScope>((kj *)this,(BrandScope *)newLeafId);
    pBVar1 = OVar2.ptr;
  }
  else {
    this_00 = kj::_::readMaybe<capnp::compiler::BrandScope,decltype(nullptr)>
                        ((Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_> *)
                         (newLeafId + 0x18));
    if (this_00 == (Own<capnp::compiler::BrandScope,_std::nullptr_t> *)0x0) {
      OVar2 = kj::
              refcounted<capnp::compiler::BrandScope,capnp::compiler::ErrorReporter&,unsigned_long&>
                        ((kj *)this,*(ErrorReporter **)(newLeafId + 0x10),(unsigned_long *)&_p318);
      pBVar1 = OVar2.ptr;
    }
    else {
      pBVar1 = kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::operator->(this_00);
      OVar2 = pop(this,(uint64_t)pBVar1);
      pBVar1 = OVar2.ptr;
    }
  }
  OVar2.ptr = pBVar1;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

kj::Own<BrandScope> BrandScope::pop(uint64_t newLeafId) {
  if (leafId == newLeafId) {
    return kj::addRef(*this);
  }
  KJ_IF_SOME(p, parent) {
    return p->pop(newLeafId);
  } else {
    // Looks like we're moving into a whole top-level scope.
    return kj::refcounted<BrandScope>(errorReporter, newLeafId);
  }
}